

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Label * __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::GetLabel(BinaryReaderInterp *this,Index depth)

{
  size_type sVar1;
  reference pvVar2;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  sVar1 = std::
          vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
          ::size(&this->label_stack_);
  if (depth < sVar1) {
    sVar1 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    pvVar2 = std::
             vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ::operator[](&this->label_stack_,(sVar1 - depth) - 1);
    return pvVar2;
  }
  __assert_fail("depth < label_stack_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x14f,
                "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)");
}

Assistant:

Label* BinaryReaderInterp::GetLabel(Index depth) {
  assert(depth < label_stack_.size());
  return &label_stack_[label_stack_.size() - depth - 1];
}